

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTMath.cpp
# Opt level: O0

void __thiscall RTQuaternion::toAngleVector(RTQuaternion *this,RTFLOAT *angle,RTVector3 *vec)

{
  float fVar1;
  double dVar2;
  double dVar3;
  RTFLOAT sinHalfTheta;
  RTFLOAT halfTheta;
  RTVector3 *vec_local;
  RTFLOAT *angle_local;
  RTQuaternion *this_local;
  
  dVar2 = std::acos((double)(ulong)(uint)this->m_data[0]);
  dVar3 = std::sin((double)((ulong)dVar2 & 0xffffffff));
  fVar1 = SUB84(dVar3,0);
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    RTVector3::setX(vec,this->m_data[1] / fVar1);
    RTVector3::setY(vec,this->m_data[1] / fVar1);
    RTVector3::setZ(vec,this->m_data[1] / fVar1);
  }
  else {
    RTVector3::setX(vec,1.0);
    RTVector3::setY(vec,0.0);
    RTVector3::setZ(vec,0.0);
  }
  *angle = SUB84(dVar2,0) * 2.0;
  return;
}

Assistant:

void RTQuaternion::toAngleVector(RTFLOAT& angle, RTVector3& vec)
{
    RTFLOAT halfTheta;
    RTFLOAT sinHalfTheta;

    halfTheta = acos(m_data[0]);
    sinHalfTheta = sin(halfTheta);

    if (sinHalfTheta == 0) {
        vec.setX(1.0);
        vec.setY(0);
        vec.setZ(0);
    } else {
        vec.setX(m_data[1] / sinHalfTheta);
        vec.setY(m_data[1] / sinHalfTheta);
        vec.setZ(m_data[1] / sinHalfTheta);
    }
    angle = 2.0 * halfTheta;
}